

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

BOOL JS_NumberIsNegativeOrMinusZero(JSContext *ctx,JSValue val)

{
  JSFloat64Union u;
  int v;
  uint32_t tag;
  JSContext *ctx_local;
  JSValue val_local;
  undefined4 local_4;
  
  val_local.tag._0_4_ = (int)val.tag;
  if ((int)val_local.tag == 0) {
    val_local.u.int32 = val.u._0_4_;
    local_4 = (uint)(val_local.u.int32 < 0);
  }
  else if ((int)val_local.tag == 7) {
    local_4 = val.u._4_4_ >> 0x1f;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static BOOL JS_NumberIsNegativeOrMinusZero(JSContext *ctx, JSValueConst val)
{
    uint32_t tag;

    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
        {
            int v;
            v = JS_VALUE_GET_INT(val);
            return (v < 0);
        }
    case JS_TAG_FLOAT64:
        {
            JSFloat64Union u;
            u.d = JS_VALUE_GET_FLOAT64(val);
            return (u.u64 >> 63);
        }
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            /* Note: integer zeros are not necessarily positive */
            return p->num.sign && !bf_is_zero(&p->num);
        }
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            return p->num.sign;
        }
        break;
    case JS_TAG_BIG_DECIMAL:
        {
            JSBigDecimal *p = JS_VALUE_GET_PTR(val);
            return p->num.sign;
        }
        break;
#endif
    default:
        return FALSE;
    }
}